

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
::nosize_unchecked_emplace_at<slang::SVInt>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_set_types<slang::SVInt>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::SVInt,_void>,_std::equal_to<slang::SVInt>,_slang::detail::hashing::StackAllocator<slang::SVInt,_128UL,_16UL>_>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,SVInt *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  bool bVar3;
  bool bVar4;
  value_type_pointer pSVar5;
  uint uVar6;
  ushort uVar7;
  ulong uVar8;
  long lVar9;
  SVInt *pSVar10;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar11;
  group_type_pointer pgVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  
  pgVar12 = __return_storage_ptr__->pg;
  uVar8 = (ulong)__return_storage_ptr__->n;
  pSVar10 = __return_storage_ptr__->p;
  lVar9 = 1;
  while( true ) {
    pgVar1 = arrays_->groups_ + pos0;
    pgVar2 = arrays_->groups_ + pos0;
    auVar14[0] = -(pgVar2->m[0].n == '\0');
    auVar14[1] = -(pgVar2->m[1].n == '\0');
    auVar14[2] = -(pgVar2->m[2].n == '\0');
    auVar14[3] = -(pgVar2->m[3].n == '\0');
    auVar14[4] = -(pgVar2->m[4].n == '\0');
    auVar14[5] = -(pgVar2->m[5].n == '\0');
    auVar14[6] = -(pgVar2->m[6].n == '\0');
    auVar14[7] = -(pgVar2->m[7].n == '\0');
    auVar14[8] = -(pgVar2->m[8].n == '\0');
    auVar14[9] = -(pgVar2->m[9].n == '\0');
    auVar14[10] = -(pgVar2->m[10].n == '\0');
    auVar14[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar14[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar14[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar14[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar14[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar7 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
    if (uVar7 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar6 = 0;
      if (uVar7 != 0) {
        for (; (uVar7 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      uVar8 = (ulong)uVar6;
      pSVar5 = arrays_->elements_;
      uVar13 = (ulong)(uVar6 << 4);
      uVar6 = (args->super_SVIntStorage).bitWidth;
      bVar3 = (args->super_SVIntStorage).signFlag;
      bVar4 = (args->super_SVIntStorage).unknownFlag;
      *(undefined8 *)((long)&pSVar5[pos0 * 0xf].super_SVIntStorage.field_0 + uVar13) = 0;
      *(uint *)((long)&pSVar5[pos0 * 0xf].super_SVIntStorage.bitWidth + uVar13) = uVar6;
      (&pSVar5[pos0 * 0xf].super_SVIntStorage.signFlag)[uVar13] = bVar3;
      (&pSVar5[pos0 * 0xf].super_SVIntStorage.unknownFlag)[uVar13] = bVar4;
      if (uVar6 < 0x41 && (bVar4 & 1U) == 0) {
        aVar11 = (args->super_SVIntStorage).field_0;
      }
      else {
        aVar11 = (args->super_SVIntStorage).field_0;
        (args->super_SVIntStorage).field_0.val = 0;
      }
      pSVar10 = (SVInt *)((long)&pSVar5[pos0 * 0xf].super_SVIntStorage.field_0 + uVar13);
      (pSVar10->super_SVIntStorage).field_0 = aVar11;
      pgVar1->m[uVar8].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar12 = pgVar1;
    }
    if (uVar7 != 0) break;
    pos0 = pos0 + lVar9 & arrays_->groups_size_mask;
    lVar9 = lVar9 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar8;
  __return_storage_ptr__->p = pSVar10;
  __return_storage_ptr__->pg = pgVar12;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }